

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.c
# Opt level: O1

sexp_conflict
sexp_make_thread(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict thunk,
                sexp_conflict name)

{
  sexp psVar1;
  sexp_conflict psVar2;
  sexp_conflict res;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp_conflict local_40;
  sexp_gc_var_t local_38;
  
  local_40 = (sexp_conflict)0x43e;
  local_38.var = (sexp_conflict *)0x0;
  local_38.next = (sexp_gc_var_t *)0x0;
  if ((((ulong)thunk & 3) == 0) && (thunk->tag == 0x14)) {
    local_38.var = &local_40;
    local_38.next = (ctx->value).context.saves;
    (ctx->value).context.saves = &local_38;
    local_40 = (sexp_conflict)sexp_make_eval_context(ctx,0x3e,(ctx->value).type.cpl,0,0);
    (local_40->value).type.finalize_name = name;
    (local_40->value).type.dl = thunk;
    (local_40->value).context.ip = (uchar *)((long)&((thunk->value).type.name)->value + 0x28);
    psVar1 = (local_40->value).type.name;
    (psVar1->value).type.id = (sexp)0x1;
    (psVar1->value).bytecode.length = 1;
    (psVar1->value).uvector.length = 1;
    (psVar1->value).type.setters =
         (sexp)(((ctx->value).type.setters)->value).context.mark_stack[5].end;
    (((local_40->value).type.name)->value).string.offset = 4;
    (local_40->value).context.last_fp = 0;
    psVar1 = (sexp)sexp_make_vector_op(local_40,0,2,9,0x3e);
    (local_40->value).type.id = psVar1;
    (psVar1->value).string.offset = 1;
    (local_40->value).port.offset = 0x23e;
    (ctx->value).context.saves = local_38.next;
    return local_40;
  }
  psVar2 = (sexp_conflict)sexp_type_exception(ctx,self,0x14,thunk);
  return psVar2;
}

Assistant:

sexp sexp_make_thread (sexp ctx, sexp self, sexp_sint_t n, sexp thunk, sexp name) {
  sexp *stack;
  sexp_gc_var1(res);
  sexp_assert_type(ctx, sexp_procedurep, SEXP_PROCEDURE, thunk);
  sexp_gc_preserve1(ctx, res);
  res = sexp_make_eval_context(ctx, SEXP_FALSE, sexp_context_env(ctx), 0, 0);
  sexp_context_name(res) = name;
  sexp_context_proc(res) = thunk;
  sexp_context_ip(res) = sexp_bytecode_data(sexp_procedure_code(thunk));
  stack = sexp_stack_data(sexp_context_stack(res));
  stack[0] = stack[1] = stack[3] = SEXP_ZERO;
  stack[2] = sexp_global(ctx, SEXP_G_FINAL_RESUMER);
  sexp_context_top(res) = 4;
  sexp_context_last_fp(res) = 0;
  sexp_context_dk(res) = sexp_make_vector(res, SEXP_FOUR, SEXP_FALSE);
  sexp_vector_set(sexp_context_dk(res), SEXP_ZERO, SEXP_ZERO);
  /* reset parameters */
  sexp_context_params(res) = SEXP_NULL;
  /* alternately reset only the current exception handler */
  /* for (ls1=sexp_context_params(ctx), ls2=SEXP_NULL; sexp_pairp(ls1); ls1=sexp_cdr(ls1)) */
  /*   if (sexp_caar(ls1) != sexp_global(ctx, SEXP_G_ERR_HANDLER)) */
  /*     ls2 = sexp_cons(ctx, sexp_car(ls1), ls2); */
  /* sexp_context_params(res) = ls2; */
  sexp_gc_release1(ctx);
  return res;
}